

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpinternalsourcedata.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPInternalSourceData::ProcessRTPPacket
          (RTPInternalSourceData *this,RTPPacket *rtppack,RTPTime *receivetime,bool *stored,
          RTPSources *sources)

{
  size_t *psVar1;
  uint uVar2;
  _List_node_base *p_Var3;
  RTPMemoryManager *pRVar4;
  byte bVar5;
  _List_node_base *p_Var6;
  uint uVar7;
  double tsunit;
  bool accept;
  bool onprobation;
  bool ispackethandled;
  bool local_2b;
  bool local_2a;
  char local_29;
  
  *stored = false;
  tsunit = (this->super_RTPSourceData).timestampunit;
  if (tsunit < 0.0) {
    tsunit = RTPSourceData::INF_GetEstimatedTimestampUnit(&this->super_RTPSourceData);
  }
  RTPSourceStats::ProcessPacket
            (&(this->super_RTPSourceData).stats,rtppack,receivetime,tsunit,
             (this->super_RTPSourceData).ownssrc,&local_2b,
             (bool)(~(this->super_RTPSourceData).validated & this->probationtype != NoProbation),
             &local_2a);
  if (this->probationtype < ProbationStore) {
joined_r0x0012cb25:
    if (local_2b == false) {
      return 0;
    }
LAB_0012ca5f:
    (this->super_RTPSourceData).validated = true;
  }
  else {
    if (this->probationtype != ProbationStore) {
      return -0x76;
    }
    if (local_2a == false) {
      local_2b = (bool)(local_2b & 1);
      goto joined_r0x0012cb25;
    }
    if ((local_2b & 1U) != 0) goto LAB_0012ca5f;
    bVar5 = 1;
    if (((this->super_RTPSourceData).validated & 1U) == 0) goto LAB_0012ca6f;
  }
  if ((this->super_RTPSourceData).ownssrc == false) {
    (this->super_RTPSourceData).issender = true;
  }
  bVar5 = 0;
LAB_0012ca6f:
  local_29 = '\0';
  (*(sources->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x13])
            (sources,this,rtppack,(ulong)bVar5,&local_29);
  if (local_29 != '\x01') {
    p_Var6 = (this->super_RTPSourceData).packetlist.
             super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    if (p_Var6 == (_List_node_base *)&(this->super_RTPSourceData).packetlist) {
      *stored = true;
      p_Var6 = (_List_node_base *)operator_new(0x18);
      p_Var6[1]._M_next = (_List_node_base *)rtppack;
LAB_0012cbc9:
      std::__detail::_List_node_base::_M_hook(p_Var6);
      psVar1 = &(this->super_RTPSourceData).packetlist.
                super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>.
                _M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      return 0;
    }
    if (((this->super_RTPSourceData).validated == false) &&
       ((this->super_RTPSourceData).packetlist.
        super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>._M_impl.
        _M_node._M_size == 0x20)) {
      p_Var3 = p_Var6[1]._M_next;
      (this->super_RTPSourceData).packetlist.
      super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>._M_impl._M_node.
      _M_size = 0x1f;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var6,0x18);
      pRVar4 = (this->super_RTPSourceData).super_RTPMemoryObject.mgr;
      if (pRVar4 == (RTPMemoryManager *)0x0) {
        if (p_Var3 != (_List_node_base *)0x0) {
          (**(code **)((long)p_Var3->_M_next + 8))(p_Var3);
        }
      }
      else {
        (**(code **)p_Var3->_M_next)(p_Var3);
        (**(code **)(*(long *)pRVar4 + 0x18))(pRVar4,p_Var3);
      }
    }
    uVar2 = rtppack->extseqnr;
    p_Var6 = (this->super_RTPSourceData).packetlist.
             super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>._M_impl.
             _M_node.super__List_node_base._M_prev;
    uVar7 = *(uint *)&p_Var6[1]._M_next[2]._M_next;
    if (uVar2 < uVar7) {
      do {
        if (p_Var6 == (this->super_RTPSourceData).packetlist.
                      super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>.
                      _M_impl._M_node.super__List_node_base._M_next) {
          *stored = true;
          p_Var6 = (_List_node_base *)operator_new(0x18);
          p_Var6[1]._M_next = (_List_node_base *)rtppack;
          goto LAB_0012cbc9;
        }
        p_Var6 = p_Var6->_M_prev;
        uVar7 = *(uint *)&p_Var6[1]._M_next[2]._M_next;
      } while (uVar2 < uVar7);
    }
    if (uVar2 <= uVar7) {
      return 0;
    }
    p_Var6 = (_List_node_base *)operator_new(0x18);
    p_Var6[1]._M_next = (_List_node_base *)rtppack;
    std::__detail::_List_node_base::_M_hook(p_Var6);
    psVar1 = &(this->super_RTPSourceData).packetlist.
              super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  *stored = true;
  return 0;
}

Assistant:

int RTPInternalSourceData::ProcessRTPPacket(RTPPacket *rtppack,const RTPTime &receivetime,bool *stored,RTPSources *sources)
{
	bool accept,onprobation,applyprobation;
	double tsunit;
	
	*stored = false;
	
	if (timestampunit < 0) 
		tsunit = INF_GetEstimatedTimestampUnit();
	else
		tsunit = timestampunit;

#ifdef RTP_SUPPORT_PROBATION
	if (validated) 				// If the source is our own process, we can already be validated. No 
		applyprobation = false;		// probation should be applied in that case.
	else
	{
		if (probationtype == RTPSources::NoProbation)
			applyprobation = false;
		else
			applyprobation = true;
	}
#else
	applyprobation = false;
#endif // RTP_SUPPORT_PROBATION

	stats.ProcessPacket(rtppack,receivetime,tsunit,ownssrc,&accept,applyprobation,&onprobation);

#ifdef RTP_SUPPORT_PROBATION
	switch (probationtype)
	{
		case RTPSources::ProbationStore:
			if (!(onprobation || accept))
				return 0;
			if (accept)
				validated = true;
			break;
		case RTPSources::ProbationDiscard:
		case RTPSources::NoProbation:
			if (!accept)
				return 0;
			validated = true;
			break;
		default:
			return ERR_RTP_INTERNALSOURCEDATA_INVALIDPROBATIONTYPE;
	}
#else
	if (!accept)
		return 0;
	validated = true;
#endif // RTP_SUPPORT_PROBATION;
	
	if (validated && !ownssrc) // for own ssrc these variables depend on the outgoing packets, not on the incoming
		issender = true;
	
	bool isonprobation = !validated;
	bool ispackethandled = false;

	sources->OnValidatedRTPPacket(this, rtppack, isonprobation, &ispackethandled);
	if (ispackethandled) // Packet is already handled in the callback, no need to store it in the list
	{
		// Set 'stored' to true to avoid the packet being deallocated
		*stored = true;
		return 0;
	}

	// Now, we can place the packet in the queue
	
	if (packetlist.empty())
	{
		*stored = true;
		packetlist.push_back(rtppack);
		return 0;
	}
	
	if (!validated) // still on probation
	{
		// Make sure that we don't buffer too much packets to avoid wasting memory
		// on a bad source. Delete the packet in the queue with the lowest sequence
		// number.
		if (packetlist.size() == RTPINTERNALSOURCEDATA_MAXPROBATIONPACKETS)
		{
			RTPPacket *p = *(packetlist.begin());
			packetlist.pop_front();
			RTPDelete(p,GetMemoryManager());
		}
	}

	// find the right position to insert the packet
	
	std::list<RTPPacket*>::iterator it,start;
	bool done = false;
	uint32_t newseqnr = rtppack->GetExtendedSequenceNumber();
	
	it = packetlist.end();
	--it;
	start = packetlist.begin();
	
	while (!done)
	{
		RTPPacket *p;
		uint32_t seqnr;
		
		p = *it;
		seqnr = p->GetExtendedSequenceNumber();
		if (seqnr > newseqnr)
		{
			if (it != start)
				--it;
			else // we're at the start of the list
			{
				*stored = true;
				done = true;
				packetlist.push_front(rtppack);
			}
		}
		else if (seqnr < newseqnr) // insert after this packet
		{
			++it;
			packetlist.insert(it,rtppack);
			done = true;
			*stored = true;
		}
		else // they're equal !! Drop packet
		{
			done = true;
		}
	}

	return 0;
}